

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O0

void __thiscall OPL::DOSBox::DBOPL::Operator::UpdateRelease(Operator *this,Chip *chip)

{
  byte bVar1;
  Bit8u val;
  Bit8u rate;
  Chip *chip_local;
  Operator *this_local;
  
  bVar1 = this->reg80 & 0xf;
  if (bVar1 == 0) {
    this->rateZero = this->rateZero | 2;
    this->releaseAdd = 0;
    if ((this->reg20 & 0x20) == 0) {
      this->rateZero = this->rateZero | 4;
    }
  }
  else {
    this->releaseAdd = chip->linearRates[(byte)(bVar1 * '\x04' + this->ksr)];
    this->rateZero = this->rateZero & 0xfd;
    if ((this->reg20 & 0x20) == 0) {
      this->rateZero = this->rateZero & 0xfb;
    }
  }
  return;
}

Assistant:

inline void Operator::UpdateRelease( const Chip* chip ) {
	Bit8u rate = reg80 & 0xf;
	if ( rate ) {
		Bit8u val = (rate << 2) + ksr;
		releaseAdd = chip->linearRates[ val ];
		rateZero &= ~(1 << RELEASE);
		if ( !(reg20 & MASK_SUSTAIN ) ) {
			rateZero &= ~( 1 << SUSTAIN );
		}
	} else {
		rateZero |= (1 << RELEASE);
		releaseAdd = 0;
		if ( !(reg20 & MASK_SUSTAIN ) ) {
			rateZero |= ( 1 << SUSTAIN );
		}
	}
}